

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscrollbar.cpp
# Opt level: O1

QMenu * __thiscall QScrollBar::createStandardContextMenu(QScrollBar *this,QPoint position)

{
  int iVar1;
  QWidgetPrivate *this_00;
  tuple<QTLWExtra_*,_std::default_delete<QTLWExtra>_> tVar2;
  int *piVar3;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 this_01;
  QWidget *pQVar4;
  QWindow *pQVar5;
  QObject *pQVar6;
  undefined8 uVar7;
  QAction *pQVar8;
  undefined4 *puVar9;
  int iVar10;
  long in_FS_OFFSET;
  QAnyStringView QVar11;
  QString local_68;
  QObject local_50 [8];
  code *local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = *(int *)(*(long *)&(this->super_QAbstractSlider).super_QWidget.field_0x8 + 0x280);
  this_01.m_data = operator_new(0x28);
  QMenu::QMenu((QMenu *)this_01.m_data,(QWidget *)0x0);
  QVar11.m_size = (size_t)"qt_scrollbar_menu";
  QVar11.field_0.m_data = this_01.m_data;
  QObject::setObjectName(QVar11);
  pQVar4 = QWidget::window((QWidget *)this);
  if (pQVar4 != (QWidget *)0x0) {
    pQVar4 = QWidget::window((QWidget *)this);
    pQVar5 = QWidget::windowHandle(pQVar4);
    if (pQVar5 != (QWindow *)0x0) {
      this_00 = *(QWidgetPrivate **)((long)this_01.m_data + 8);
      QWidgetPrivate::createTLExtra(this_00);
      tVar2.super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
      super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl =
           *(_Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_> *)
            &(((this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>.
               _M_t.super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
               super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->topextra)._M_t.
             super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>;
      if (tVar2.super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
          super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl !=
          (_Head_base<0UL,_QTLWExtra_*,_false>)0x0) {
        pQVar4 = QWidget::window((QWidget *)this);
        QWidget::windowHandle(pQVar4);
        pQVar6 = (QObject *)QWindow::screen();
        if (pQVar6 == (QObject *)0x0) {
          uVar7 = 0;
        }
        else {
          uVar7 = QtSharedPointer::ExternalRefCountData::getAndRef(pQVar6);
        }
        piVar3 = *(int **)((long)tVar2.
                                 super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>
                                 .super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0xb8);
        *(undefined8 *)
         ((long)tVar2.super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
                super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0xb8) = uVar7;
        *(QObject **)
         ((long)tVar2.super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
                super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0xc0) = pQVar6;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            operator_delete(piVar3);
          }
        }
      }
    }
  }
  QMetaObject::tr((char *)&local_68,(char *)&staticMetaObject,0x6ebb72);
  pQVar8 = QWidget::addAction((QWidget *)this_01.m_data,&local_68);
  local_48 = QAction::triggered;
  local_40 = 0;
  puVar9 = (undefined4 *)operator_new(0x28);
  *puVar9 = 1;
  *(code **)(puVar9 + 2) =
       QtPrivate::
       QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/widgets/qscrollbar.cpp:393:46),_QtPrivate::List<>,_void>
       ::impl;
  *(QScrollBar **)(puVar9 + 4) = this;
  *(bool *)(puVar9 + 6) = iVar1 == 1;
  *(QPoint *)(puVar9 + 7) = position;
  QObject::connectImpl
            (local_50,(void **)pQVar8,(QObject *)&local_48,(void **)this,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar9,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
    }
  }
  QMenu::addSeparator((QMenu *)this_01.m_data);
  iVar10 = 0x6e9fe8;
  if (iVar1 == 1) {
    iVar10 = 0x6ebb7e;
  }
  QMetaObject::tr((char *)&local_68,(char *)&staticMetaObject,iVar10);
  pQVar8 = QWidget::addAction((QWidget *)this_01.m_data,&local_68);
  local_48 = QAction::triggered;
  local_40 = 0;
  puVar9 = (undefined4 *)operator_new(0x18);
  *puVar9 = 1;
  *(code **)(puVar9 + 2) =
       QtPrivate::
       QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/widgets/qscrollbar.cpp:397:64),_QtPrivate::List<>,_void>
       ::impl;
  *(QScrollBar **)(puVar9 + 4) = this;
  QObject::connectImpl
            (local_50,(void **)pQVar8,(QObject *)&local_48,(void **)this,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar9,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
    }
  }
  iVar10 = 0x6ebb93;
  if (iVar1 == 1) {
    iVar10 = 0x6ebb88;
  }
  QMetaObject::tr((char *)&local_68,(char *)&staticMetaObject,iVar10);
  pQVar8 = QWidget::addAction((QWidget *)this_01.m_data,&local_68);
  local_48 = QAction::triggered;
  local_40 = 0;
  puVar9 = (undefined4 *)operator_new(0x18);
  *puVar9 = 1;
  *(code **)(puVar9 + 2) =
       QtPrivate::
       QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/widgets/qscrollbar.cpp:400:68),_QtPrivate::List<>,_void>
       ::impl;
  *(QScrollBar **)(puVar9 + 4) = this;
  QObject::connectImpl
            (local_50,(void **)pQVar8,(QObject *)&local_48,(void **)this,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar9,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
    }
  }
  QMenu::addSeparator((QMenu *)this_01.m_data);
  iVar10 = 0x6ebba4;
  if (iVar1 == 1) {
    iVar10 = 0x6ebb9a;
  }
  QMetaObject::tr((char *)&local_68,(char *)&staticMetaObject,iVar10);
  pQVar8 = QWidget::addAction((QWidget *)this_01.m_data,&local_68);
  local_48 = QAction::triggered;
  local_40 = 0;
  puVar9 = (undefined4 *)operator_new(0x18);
  *puVar9 = 1;
  *(code **)(puVar9 + 2) =
       QtPrivate::
       QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/widgets/qscrollbar.cpp:404:68),_QtPrivate::List<>,_void>
       ::impl;
  *(QScrollBar **)(puVar9 + 4) = this;
  QObject::connectImpl
            (local_50,(void **)pQVar8,(QObject *)&local_48,(void **)this,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar9,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
    }
  }
  iVar10 = 0x6ebbb7;
  if (iVar1 == 1) {
    iVar10 = 0x6ebbac;
  }
  QMetaObject::tr((char *)&local_68,(char *)&staticMetaObject,iVar10);
  pQVar8 = QWidget::addAction((QWidget *)this_01.m_data,&local_68);
  local_48 = QAction::triggered;
  local_40 = 0;
  puVar9 = (undefined4 *)operator_new(0x18);
  *puVar9 = 1;
  *(code **)(puVar9 + 2) =
       QtPrivate::
       QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/widgets/qscrollbar.cpp:407:71),_QtPrivate::List<>,_void>
       ::impl;
  *(QScrollBar **)(puVar9 + 4) = this;
  QObject::connectImpl
            (local_50,(void **)pQVar8,(QObject *)&local_48,(void **)this,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar9,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
    }
  }
  QMenu::addSeparator((QMenu *)this_01.m_data);
  iVar10 = 0x6ebbcd;
  if (iVar1 == 1) {
    iVar10 = 0x6ebbc1;
  }
  QMetaObject::tr((char *)&local_68,(char *)&staticMetaObject,iVar10);
  pQVar8 = QWidget::addAction((QWidget *)this_01.m_data,&local_68);
  local_48 = QAction::triggered;
  local_40 = 0;
  puVar9 = (undefined4 *)operator_new(0x18);
  *puVar9 = 1;
  *(code **)(puVar9 + 2) =
       QtPrivate::
       QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/widgets/qscrollbar.cpp:411:72),_QtPrivate::List<>,_void>
       ::impl;
  *(QScrollBar **)(puVar9 + 4) = this;
  QObject::connectImpl
            (local_50,(void **)pQVar8,(QObject *)&local_48,(void **)this,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar9,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
    }
  }
  iVar10 = 0x6ebbe4;
  if (iVar1 == 1) {
    iVar10 = 0x6ebbd7;
  }
  QMetaObject::tr((char *)&local_68,(char *)&staticMetaObject,iVar10);
  pQVar8 = QWidget::addAction((QWidget *)this_01.m_data,&local_68);
  local_48 = QAction::triggered;
  local_40 = 0;
  puVar9 = (undefined4 *)operator_new(0x18);
  *puVar9 = 1;
  *(code **)(puVar9 + 2) =
       QtPrivate::
       QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/widgets/qscrollbar.cpp:414:75),_QtPrivate::List<>,_void>
       ::impl;
  *(QScrollBar **)(puVar9 + 4) = this;
  QObject::connectImpl
            (local_50,(void **)pQVar8,(QObject *)&local_48,(void **)this,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar9,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QMenu *)this_01.m_data;
  }
  __stack_chk_fail();
}

Assistant:

QMenu *QScrollBar::createStandardContextMenu(QPoint position)
{
#if QT_CONFIG(menu)
    const bool horiz = HORIZONTAL;
    QMenu *menu = new QMenu();
    menu->setObjectName("qt_scrollbar_menu"_L1);

    if (window() && window()->windowHandle()) {
        if (auto *menuTopData = QMenuPrivate::get(menu)->topData())
            menuTopData->initialScreen = window()->windowHandle()->screen();
    }

    menu->addAction(tr("Scroll here"), this, [this, horiz, position] {
        setValue(d_func()->pixelPosToRangeValue(horiz ? position.x() : position.y()));
    });
    menu->addSeparator();
    menu->addAction(horiz ? tr("Left edge") : tr("Top"), this, [this] {
        triggerAction(QAbstractSlider::SliderToMinimum);
    });
    menu->addAction(horiz ? tr("Right edge") : tr("Bottom"), this, [this] {
        triggerAction(QAbstractSlider::SliderToMaximum);
    });
    menu->addSeparator();
    menu->addAction(horiz ? tr("Page left") : tr("Page up"), this, [this] {
        triggerAction(QAbstractSlider::SliderPageStepSub);
    });
    menu->addAction(horiz ? tr("Page right") : tr("Page down"), this, [this] {
        triggerAction(QAbstractSlider::SliderPageStepAdd);
    });
    menu->addSeparator();
    menu->addAction(horiz ? tr("Scroll left") : tr("Scroll up"), this, [this] {
        triggerAction(QAbstractSlider::SliderSingleStepSub);
    });
    menu->addAction(horiz ? tr("Scroll right") : tr("Scroll down"), this, [this] {
        triggerAction(QAbstractSlider::SliderSingleStepAdd);
    });
    return menu;
#else
    Q_UNUSED(position);
    return nullptr;
#endif // QT_CONFIG(menu)
}